

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O2

double soplex::maxPrescaledRatio<double>
                 (SPxLPBase<double> *lp,vector<double,_std::allocator<double>_> *coScaleval,
                 bool rowRatio)

{
  uint uVar1;
  long lVar2;
  LPRowSetBase<double> *pLVar3;
  double dVar4;
  double *pdVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  bool bVar13;
  Real RVar14;
  double dVar15;
  double local_b0;
  double local_a8;
  double local_a0;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_68;
  undefined8 local_58;
  ulong uStack_50;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  bVar13 = (int)CONCAT71(in_register_00000011,rowRatio) != 0;
  pLVar3 = (LPRowSetBase<double> *)&lp->super_LPColSetBase<double>;
  if (bVar13) {
    pLVar3 = &lp->super_LPRowSetBase<double>;
  }
  uVar1 = (pLVar3->super_SVSetBase<double>).set.thenum;
  lVar7 = 0xe8;
  if (bVar13) {
    lVar7 = 0x20;
  }
  lVar8 = 0xf0;
  if (bVar13) {
    lVar8 = 0x28;
  }
  uVar9 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar9;
  }
  local_b0 = 0.0;
  for (; uVar9 != uVar6; uVar9 = uVar9 + 1) {
    plVar12 = (long *)((long)*(int *)(*(long *)((long)&(lp->super_LPRowSetBase<double>).
                                                       super_SVSetBase<double>.
                                                       super_ClassArray<soplex::Nonzero<double>_>.
                                                       _vptr_ClassArray + lVar8) + 4 + uVar9 * 8) *
                       0x28 + *(long *)((long)&(lp->super_LPRowSetBase<double>).
                                               super_SVSetBase<double>.
                                               super_ClassArray<soplex::Nonzero<double>_>.
                                               _vptr_ClassArray + lVar7));
    pdVar5 = (double *)infinity();
    local_a0 = *pdVar5;
    local_a8 = 0.0;
    lVar10 = 8;
    for (lVar11 = 0; lVar11 < *(int *)((long)plVar12 + 0xc); lVar11 = lVar11 + 1) {
      lVar2 = *plVar12;
      local_58 = ABS(*(double *)(lVar2 + -8 + lVar10)) *
                 (coScaleval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[*(uint *)(lVar2 + lVar10)];
      uStack_50 = 0;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,
                 &(lp->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar14 = Tolerances::epsilon(local_68._M_ptr);
      local_48 = ABS(local_58);
      uStack_40 = (undefined4)(uStack_50 & 0x7fffffffffffffff);
      uStack_3c = (undefined4)((uStack_50 & 0x7fffffffffffffff) >> 0x20);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      dVar4 = local_a8;
      if (RVar14 < local_48) {
        dVar15 = local_58;
        if (local_a0 <= local_58) {
          dVar15 = local_a0;
        }
        dVar4 = local_58;
        local_a0 = dVar15;
        if (local_58 <= local_a8) {
          dVar4 = local_a8;
        }
      }
      local_a8 = dVar4;
      lVar10 = lVar10 + 0x10;
    }
    pdVar5 = (double *)infinity();
    if (((local_a0 != *pdVar5) || (dVar4 = local_b0, NAN(local_a0) || NAN(*pdVar5))) &&
       (dVar4 = local_a8 / local_a0, local_a8 / local_a0 <= local_b0)) {
      dVar4 = local_b0;
    }
    local_b0 = dVar4;
  }
  return local_b0;
}

Assistant:

static R maxPrescaledRatio(const SPxLPBase<R>& lp, const std::vector<R>& coScaleval, bool rowRatio)
{
   R pmax = 0.0;
   const int n = rowRatio ? lp.nRows() : lp.nCols();

   for(int i = 0; i < n; ++i)
   {
      const SVectorBase<R>& vec = rowRatio ? lp.rowVector(i) : lp.colVector(i);
      R mini = R(infinity);
      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j)) * coScaleval[unsigned(vec.index(j))];

         if(isZero(x, lp.tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}